

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixpoint.cpp
# Opt level: O2

int32_t fix_ATan2(int32_t i,int32_t j,int32_t q)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ldexp(1.0,q);
  dVar2 = ldexp(1.0,q);
  dVar1 = atan2((double)i / dVar1,(double)j / dVar2);
  dVar2 = ldexp(1.0,q);
  dVar1 = round(dVar2 * (dVar1 / 6.283185307179586));
  return (int)dVar1;
}

Assistant:

int32_t fix_ATan2(int32_t i, int32_t j, int32_t q)
{
	return double2fix(rad2turn(atan2(fix2double(i, q), fix2double(j, q))), q);
}